

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O1

Result * __thiscall
CoreML::LinearModel::setWeights
          (Result *__return_storage_ptr__,LinearModel *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *weights)

{
  int iVar1;
  Model *this_00;
  Pipeline *pPVar2;
  pointer pdVar3;
  Result *pRVar4;
  GLMRegressor *this_01;
  Type *pTVar5;
  pointer pdVar6;
  pointer __x;
  double dVar7;
  vector<double,_std::allocator<double>_> w;
  vector<double,_std::allocator<double>_> local_60;
  Result *local_48;
  pointer local_40;
  double local_38;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 300) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 300;
    this_01 = (GLMRegressor *)operator_new(0x48);
    Specification::GLMRegressor::GLMRegressor(this_01);
    (this_00->Type_).glmregressor_ = this_01;
  }
  __x = (weights->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (weights->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_48 = __return_storage_ptr__;
  if (__x != local_40) {
    pPVar2 = (this_00->Type_).pipeline_;
    do {
      std::vector<double,_std::allocator<double>_>::vector(&local_60,__x);
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                         (&(pPVar2->models_).super_RepeatedPtrFieldBase,(Type *)0x0);
      pdVar3 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pdVar6 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar1 = (pTVar5->value_).total_size_;
          dVar7 = *pdVar6;
          if ((pTVar5->value_).current_size_ == iVar1) {
            local_38 = *pdVar6;
            google::protobuf::RepeatedField<double>::Reserve(&pTVar5->value_,iVar1 + 1);
            dVar7 = local_38;
          }
          iVar1 = (pTVar5->value_).current_size_;
          (pTVar5->value_).current_size_ = iVar1 + 1;
          ((pTVar5->value_).rep_)->elements[iVar1] = dVar7;
          pdVar6 = pdVar6 + 1;
        } while (pdVar6 != pdVar3);
      }
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != local_40);
  }
  pRVar4 = local_48;
  Result::Result(local_48);
  return pRVar4;
}

Assistant:

Result LinearModel::setWeights(std::vector< std::vector<double>> weights) {
        auto lr = m_spec->mutable_glmregressor();
        for(auto w : weights) {
            Specification::GLMRegressor::DoubleArray* cur_arr = lr->add_weights();
            for(double n : w) {
                cur_arr->add_value(n);
            }
        }
        return Result();
    }